

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O1

v4sf * rfftb1_ps(int n,v4sf *input_readonly,v4sf *work1,v4sf *work2,float *wa,int *ifac)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  uint uVar5;
  int iVar6;
  uint l1;
  ulong uVar7;
  long lVar8;
  v4sf *pafVar9;
  v4sf *pafVar10;
  ulong uVar11;
  v4sf *pafVar12;
  v4sf *pafVar13;
  int iVar14;
  long lVar15;
  v4sf *pafVar16;
  long lVar17;
  int iVar18;
  v4sf *pafVar19;
  v4sf *pafVar20;
  long lVar21;
  v4sf *pafVar22;
  long lVar23;
  v4sf *pafVar24;
  long lVar25;
  long lVar26;
  v4sf *pafVar27;
  long lVar28;
  bool bVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  int local_100;
  ulong local_f8;
  v4sf *local_f0;
  v4sf *local_98;
  v4sf *local_90;
  
  local_f0 = work2;
  if (input_readonly == work2) {
    local_f0 = work1;
  }
  if (local_f0 != input_readonly) {
    uVar5 = ifac[1];
    if (0 < (int)uVar5) {
      iVar14 = 0;
      uVar7 = 1;
      lVar17 = 1;
      do {
        iVar6 = ifac[lVar17 + 1];
        l1 = (uint)uVar7;
        local_100 = n / (int)(iVar6 * l1);
        switch(iVar6) {
        case 2:
          radb2_ps(local_100,l1,input_readonly,local_f0,wa + iVar14);
          break;
        case 3:
          if (0 < (int)l1) {
            lVar8 = (long)local_100;
            uVar11 = uVar7;
            pafVar9 = input_readonly;
            pafVar13 = local_f0;
            do {
              pafVar19 = pafVar9 + lVar8 * 2 + -1;
              fVar41 = (*pafVar19)[0] + (*pafVar19)[0];
              fVar30 = (*pafVar19)[1] + (*pafVar19)[1];
              fVar31 = (*pafVar19)[2] + (*pafVar19)[2];
              fVar32 = (*pafVar19)[3] + (*pafVar19)[3];
              fVar35 = (*pafVar9)[1];
              fVar37 = (*pafVar9)[2];
              fVar39 = (*pafVar9)[3];
              fVar33 = fVar41 * -0.5 + (*pafVar9)[0];
              fVar34 = fVar30 * -0.5 + fVar35;
              fVar36 = fVar31 * -0.5 + fVar37;
              fVar38 = fVar32 * -0.5 + fVar39;
              (*pafVar13)[0] = fVar41 + (*pafVar9)[0];
              (*pafVar13)[1] = fVar30 + fVar35;
              (*pafVar13)[2] = fVar31 + fVar37;
              (*pafVar13)[3] = fVar32 + fVar39;
              pafVar19 = pafVar9 + lVar8 * 2;
              fVar35 = (*pafVar19)[0] * 1.7320508;
              fVar37 = (*pafVar19)[1] * 1.7320508;
              fVar39 = (*pafVar19)[2] * 1.7320508;
              fVar41 = (*pafVar19)[3] * 1.7320508;
              pfVar2 = (float *)((long)*pafVar13 + lVar8 * 0x10 * uVar7);
              *pfVar2 = fVar33 - fVar35;
              pfVar2[1] = fVar34 - fVar37;
              pfVar2[2] = fVar36 - fVar39;
              pfVar2[3] = fVar38 - fVar41;
              pfVar2 = (float *)((long)*pafVar13 + (ulong)(l1 * 2) * lVar8 * 0x10);
              *pfVar2 = fVar35 + fVar33;
              pfVar2[1] = fVar37 + fVar34;
              pfVar2[2] = fVar39 + fVar36;
              pfVar2[3] = fVar41 + fVar38;
              pafVar13 = pafVar13 + lVar8;
              pafVar9 = pafVar9 + lVar8 * 3;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
          if (local_100 != 1 && 0 < (int)l1) {
            lVar8 = (long)local_100;
            local_f8 = 0;
            do {
              if (2 < local_100) {
                lVar21 = (local_f8 * 3 + 2) * lVar8;
                lVar23 = (local_f8 * 3 + 1) * lVar8;
                lVar15 = local_f8 * 3 * lVar8;
                lVar26 = (local_f8 + uVar7) * lVar8;
                lVar28 = (local_f8 + l1 * 2) * lVar8;
                lVar25 = 2;
                do {
                  lVar1 = lVar25 + -1;
                  pfVar2 = (float *)((long)*input_readonly +
                                    ((long)(((ulong)(uint)((int)lVar23 + (int)(lVar8 - lVar25)) <<
                                            0x20) + -0x100000000) >> 0x1c));
                  fVar35 = *pfVar2;
                  fVar37 = pfVar2[1];
                  fVar39 = pfVar2[2];
                  fVar41 = pfVar2[3];
                  pafVar9 = input_readonly + lVar1 + lVar21;
                  fVar30 = (*pafVar9)[0];
                  fVar31 = (*pafVar9)[1];
                  fVar32 = (*pafVar9)[2];
                  fVar33 = (*pafVar9)[3];
                  fVar56 = fVar30 + fVar35;
                  fVar51 = fVar31 + fVar37;
                  fVar53 = fVar32 + fVar39;
                  fVar55 = fVar33 + fVar41;
                  pafVar9 = input_readonly + lVar1 + lVar15;
                  fVar34 = (*pafVar9)[0];
                  fVar36 = (*pafVar9)[1];
                  fVar38 = (*pafVar9)[2];
                  fVar40 = (*pafVar9)[3];
                  pafVar9 = local_f0 + lVar1 + local_f8 * lVar8;
                  (*pafVar9)[0] = fVar56 + fVar34;
                  (*pafVar9)[1] = fVar51 + fVar36;
                  (*pafVar9)[2] = fVar53 + fVar38;
                  (*pafVar9)[3] = fVar55 + fVar40;
                  pafVar9 = input_readonly + lVar23 + (lVar8 - lVar25);
                  fVar42 = (*pafVar9)[0];
                  fVar43 = (*pafVar9)[1];
                  fVar44 = (*pafVar9)[2];
                  fVar45 = (*pafVar9)[3];
                  pafVar9 = input_readonly + lVar25 + lVar21;
                  fVar46 = (*pafVar9)[0];
                  fVar47 = (*pafVar9)[1];
                  fVar48 = (*pafVar9)[2];
                  fVar49 = (*pafVar9)[3];
                  pafVar9 = input_readonly + lVar25 + lVar15;
                  fVar50 = (*pafVar9)[1];
                  fVar52 = (*pafVar9)[2];
                  fVar54 = (*pafVar9)[3];
                  fVar34 = fVar34 - fVar56 * 0.5;
                  fVar36 = fVar36 - fVar51 * 0.5;
                  fVar38 = fVar38 - fVar53 * 0.5;
                  fVar40 = fVar40 - fVar55 * 0.5;
                  fVar57 = fVar46 - fVar42;
                  fVar58 = fVar47 - fVar43;
                  fVar59 = fVar48 - fVar44;
                  fVar60 = fVar49 - fVar45;
                  fVar56 = (*pafVar9)[0] - fVar57 * 0.5;
                  fVar51 = fVar50 - fVar58 * 0.5;
                  fVar53 = fVar52 - fVar59 * 0.5;
                  fVar55 = fVar54 - fVar60 * 0.5;
                  pafVar13 = local_f0 + lVar25 + local_f8 * lVar8;
                  (*pafVar13)[0] = fVar57 + (*pafVar9)[0];
                  (*pafVar13)[1] = fVar58 + fVar50;
                  (*pafVar13)[2] = fVar59 + fVar52;
                  (*pafVar13)[3] = fVar60 + fVar54;
                  fVar35 = (fVar30 - fVar35) * 0.8660254;
                  fVar37 = (fVar31 - fVar37) * 0.8660254;
                  fVar32 = (fVar32 - fVar39) * 0.8660254;
                  fVar33 = (fVar33 - fVar41) * 0.8660254;
                  fVar39 = (fVar46 + fVar42) * 0.8660254;
                  fVar41 = (fVar47 + fVar43) * 0.8660254;
                  fVar30 = (fVar48 + fVar44) * 0.8660254;
                  fVar31 = (fVar49 + fVar45) * 0.8660254;
                  fVar42 = fVar34 - fVar39;
                  fVar43 = fVar36 - fVar41;
                  fVar44 = fVar38 - fVar30;
                  fVar45 = fVar40 - fVar31;
                  fVar39 = fVar39 + fVar34;
                  fVar41 = fVar41 + fVar36;
                  fVar30 = fVar30 + fVar38;
                  fVar31 = fVar31 + fVar40;
                  fVar34 = fVar35 + fVar56;
                  fVar36 = fVar37 + fVar51;
                  fVar38 = fVar32 + fVar53;
                  fVar40 = fVar33 + fVar55;
                  fVar56 = fVar56 - fVar35;
                  fVar51 = fVar51 - fVar37;
                  fVar53 = fVar53 - fVar32;
                  fVar55 = fVar55 - fVar33;
                  fVar35 = wa[(long)iVar14 + lVar25 + -2];
                  fVar37 = wa[(long)iVar14 + lVar25 + -1];
                  pafVar9 = local_f0 + lVar1 + lVar26;
                  (*pafVar9)[0] = fVar42 * fVar35 - fVar37 * fVar34;
                  (*pafVar9)[1] = fVar43 * fVar35 - fVar37 * fVar36;
                  (*pafVar9)[2] = fVar44 * fVar35 - fVar37 * fVar38;
                  (*pafVar9)[3] = fVar45 * fVar35 - fVar37 * fVar40;
                  pafVar9 = local_f0 + lVar25 + lVar26;
                  (*pafVar9)[0] = fVar35 * fVar34 + fVar42 * fVar37;
                  (*pafVar9)[1] = fVar35 * fVar36 + fVar43 * fVar37;
                  (*pafVar9)[2] = fVar35 * fVar38 + fVar44 * fVar37;
                  (*pafVar9)[3] = fVar35 * fVar40 + fVar45 * fVar37;
                  fVar35 = wa[(long)(local_100 + iVar14) + lVar25 + -2];
                  fVar37 = wa[(long)(local_100 + iVar14) + lVar25 + -1];
                  pafVar9 = local_f0 + lVar1 + lVar28;
                  (*pafVar9)[0] = fVar39 * fVar35 - fVar37 * fVar56;
                  (*pafVar9)[1] = fVar41 * fVar35 - fVar37 * fVar51;
                  (*pafVar9)[2] = fVar30 * fVar35 - fVar37 * fVar53;
                  (*pafVar9)[3] = fVar31 * fVar35 - fVar37 * fVar55;
                  pafVar9 = local_f0 + lVar25 + lVar28;
                  (*pafVar9)[0] = fVar35 * fVar56 + fVar39 * fVar37;
                  (*pafVar9)[1] = fVar35 * fVar51 + fVar41 * fVar37;
                  (*pafVar9)[2] = fVar35 * fVar53 + fVar30 * fVar37;
                  (*pafVar9)[3] = fVar35 * fVar55 + fVar31 * fVar37;
                  lVar25 = lVar25 + 2;
                } while (lVar25 < lVar8);
              }
              local_f8 = local_f8 + 1;
            } while (local_f8 != uVar7);
          }
          break;
        case 4:
          radb4_ps(local_100,l1,input_readonly,local_f0,wa + iVar14,wa + (local_100 + iVar14),
                   wa + (local_100 + iVar14 + local_100));
          break;
        case 5:
          lVar15 = (long)(int)(~l1 * local_100 + -1);
          lVar8 = (long)local_100;
          if (0 < (int)l1) {
            pafVar9 = input_readonly + (long)~(local_100 * 6) + 1;
            pafVar19 = local_f0 + ((ulong)(l1 * 5) + 1) * lVar8 + 1;
            pafVar20 = local_f0 + ((ulong)(l1 * 4) + 1) * lVar8 + 1;
            pafVar22 = local_f0 + ((ulong)(l1 * 3) + 1) * lVar8 + 1;
            pafVar13 = local_f0 + ((ulong)(l1 * 2) + 1) * lVar8 + 1;
            pafVar16 = local_f0 + (uVar7 + 1) * lVar8 + 1;
            uVar11 = uVar7;
            do {
              pafVar27 = pafVar9 + lVar8 * 8 + -1;
              pafVar12 = pafVar9 + lVar8 * 8;
              fVar30 = (*pafVar12)[0] + (*pafVar12)[0];
              fVar31 = (*pafVar12)[1] + (*pafVar12)[1];
              fVar32 = (*pafVar12)[2] + (*pafVar12)[2];
              fVar33 = (*pafVar12)[3] + (*pafVar12)[3];
              pafVar10 = pafVar9 + lVar8 * 10 + -1;
              pafVar12 = pafVar9 + lVar8 * 10;
              fVar42 = (*pafVar12)[0] + (*pafVar12)[0];
              fVar43 = (*pafVar12)[1] + (*pafVar12)[1];
              fVar44 = (*pafVar12)[2] + (*pafVar12)[2];
              fVar45 = (*pafVar12)[3] + (*pafVar12)[3];
              fVar50 = (*pafVar27)[0] + (*pafVar27)[0];
              fVar52 = (*pafVar27)[1] + (*pafVar27)[1];
              fVar54 = (*pafVar27)[2] + (*pafVar27)[2];
              fVar56 = (*pafVar27)[3] + (*pafVar27)[3];
              fVar34 = (*pafVar10)[0] + (*pafVar10)[0];
              fVar36 = (*pafVar10)[1] + (*pafVar10)[1];
              fVar38 = (*pafVar10)[2] + (*pafVar10)[2];
              fVar40 = (*pafVar10)[3] + (*pafVar10)[3];
              pafVar12 = pafVar9 + lVar8 * 6;
              fVar35 = (*pafVar12)[0];
              fVar37 = (*pafVar12)[1];
              fVar39 = (*pafVar12)[2];
              fVar41 = (*pafVar12)[3];
              pafVar12 = pafVar16 + lVar15;
              (*pafVar12)[0] = fVar50 + fVar34 + fVar35;
              (*pafVar12)[1] = fVar52 + fVar36 + fVar37;
              (*pafVar12)[2] = fVar54 + fVar38 + fVar39;
              (*pafVar12)[3] = fVar56 + fVar40 + fVar41;
              fVar46 = (fVar50 * 0.309017 - fVar34 * 0.809017) + fVar35;
              fVar47 = (fVar52 * 0.309017 - fVar36 * 0.809017) + fVar37;
              fVar48 = (fVar54 * 0.309017 - fVar38 * 0.809017) + fVar39;
              fVar49 = (fVar56 * 0.309017 - fVar40 * 0.809017) + fVar41;
              fVar35 = (fVar34 * 0.309017 - fVar50 * 0.809017) + fVar35;
              fVar37 = (fVar36 * 0.309017 - fVar52 * 0.809017) + fVar37;
              fVar39 = (fVar38 * 0.309017 - fVar54 * 0.809017) + fVar39;
              fVar41 = (fVar40 * 0.309017 - fVar56 * 0.809017) + fVar41;
              fVar34 = fVar42 * 0.58778524 + fVar30 * 0.95105654;
              fVar36 = fVar43 * 0.58778524 + fVar31 * 0.95105654;
              fVar38 = fVar44 * 0.58778524 + fVar32 * 0.95105654;
              fVar40 = fVar45 * 0.58778524 + fVar33 * 0.95105654;
              fVar30 = fVar30 * 0.58778524 - fVar42 * 0.95105654;
              fVar31 = fVar31 * 0.58778524 - fVar43 * 0.95105654;
              fVar32 = fVar32 * 0.58778524 - fVar44 * 0.95105654;
              fVar33 = fVar33 * 0.58778524 - fVar45 * 0.95105654;
              pafVar12 = pafVar13 + lVar15;
              (*pafVar12)[0] = fVar46 - fVar34;
              (*pafVar12)[1] = fVar47 - fVar36;
              (*pafVar12)[2] = fVar48 - fVar38;
              (*pafVar12)[3] = fVar49 - fVar40;
              pafVar12 = pafVar22 + lVar15;
              (*pafVar12)[0] = fVar35 - fVar30;
              (*pafVar12)[1] = fVar37 - fVar31;
              (*pafVar12)[2] = fVar39 - fVar32;
              (*pafVar12)[3] = fVar41 - fVar33;
              pafVar12 = pafVar20 + lVar15;
              (*pafVar12)[0] = fVar30 + fVar35;
              (*pafVar12)[1] = fVar31 + fVar37;
              (*pafVar12)[2] = fVar32 + fVar39;
              (*pafVar12)[3] = fVar33 + fVar41;
              pafVar12 = pafVar19 + lVar15;
              (*pafVar12)[0] = fVar34 + fVar46;
              (*pafVar12)[1] = fVar36 + fVar47;
              (*pafVar12)[2] = fVar38 + fVar48;
              (*pafVar12)[3] = fVar40 + fVar49;
              pafVar19 = pafVar19 + lVar8;
              pafVar20 = pafVar20 + lVar8;
              pafVar22 = pafVar22 + lVar8;
              pafVar13 = pafVar13 + lVar8;
              pafVar16 = pafVar16 + lVar8;
              pafVar9 = pafVar9 + lVar8 * 5;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
          if (local_100 != 1 && 0 < (int)l1) {
            iVar18 = iVar14 + local_100 + local_100;
            lVar26 = (long)(local_100 * -6 + -2);
            lVar21 = (long)(iVar18 + local_100) * 4;
            lVar23 = (long)iVar18 * 4;
            lVar25 = (long)(iVar14 + local_100) * 4;
            pafVar9 = local_f0 + lVar15 + ((ulong)(l1 * 5) + 1) * lVar8 + 3;
            pafVar13 = input_readonly + lVar26 + lVar8 * 6 + 4;
            pafVar19 = input_readonly + lVar26 + lVar8 * 10 + 4;
            pafVar20 = input_readonly + lVar26 + lVar8 * 8 + 4;
            local_90 = input_readonly + lVar26 + (long)(local_100 + 2) + lVar8 * 9 + -2;
            local_98 = input_readonly + (long)(local_100 + 2) + lVar26 + lVar8 * 7 + -2;
            pafVar27 = local_f0 + lVar15 + ((ulong)(l1 * 4) + 1) * lVar8 + 3;
            pafVar22 = local_f0 + lVar15 + ((ulong)(l1 * 3) + 1) * lVar8 + 3;
            pafVar16 = local_f0 + lVar15 + ((ulong)(l1 * 2) + 1) * lVar8 + 3;
            pafVar12 = local_f0 + lVar15 + (uVar7 + 1) * lVar8 + 3;
            uVar7 = 1;
            do {
              if (2 < local_100) {
                lVar15 = 3;
                lVar26 = 0;
                pafVar10 = local_98;
                pafVar24 = local_90;
                do {
                  pfVar3 = pafVar20[-1] + lVar26;
                  pfVar2 = *pafVar20 + lVar26;
                  fVar30 = *pfVar2 + (*pafVar10)[0];
                  fVar31 = pfVar2[1] + (*pafVar10)[1];
                  fVar32 = pfVar2[2] + (*pafVar10)[2];
                  fVar33 = pfVar2[3] + (*pafVar10)[3];
                  fVar66 = *pfVar2 - (*pafVar10)[0];
                  fVar67 = pfVar2[1] - (*pafVar10)[1];
                  fVar68 = pfVar2[2] - (*pafVar10)[2];
                  fVar69 = pfVar2[3] - (*pafVar10)[3];
                  pfVar4 = pafVar19[-1] + lVar26;
                  pfVar2 = *pafVar19 + lVar26;
                  fVar50 = *pfVar2 + (*pafVar24)[0];
                  fVar52 = pfVar2[1] + (*pafVar24)[1];
                  fVar54 = pfVar2[2] + (*pafVar24)[2];
                  fVar56 = pfVar2[3] + (*pafVar24)[3];
                  fVar42 = *pfVar2 - (*pafVar24)[0];
                  fVar43 = pfVar2[1] - (*pafVar24)[1];
                  fVar44 = pfVar2[2] - (*pafVar24)[2];
                  fVar45 = pfVar2[3] - (*pafVar24)[3];
                  fVar58 = *pfVar3 - pafVar10[-1][0];
                  fVar59 = pfVar3[1] - pafVar10[-1][1];
                  fVar60 = pfVar3[2] - pafVar10[-1][2];
                  fVar61 = pfVar3[3] - pafVar10[-1][3];
                  fVar74 = *pfVar3 + pafVar10[-1][0];
                  fVar75 = pfVar3[1] + pafVar10[-1][1];
                  fVar76 = pfVar3[2] + pafVar10[-1][2];
                  fVar77 = pfVar3[3] + pafVar10[-1][3];
                  fVar62 = *pfVar4 - pafVar24[-1][0];
                  fVar63 = pfVar4[1] - pafVar24[-1][1];
                  fVar64 = pfVar4[2] - pafVar24[-1][2];
                  fVar65 = pfVar4[3] - pafVar24[-1][3];
                  fVar51 = *pfVar4 + pafVar24[-1][0];
                  fVar53 = pfVar4[1] + pafVar24[-1][1];
                  fVar55 = pfVar4[2] + pafVar24[-1][2];
                  fVar57 = pfVar4[3] + pafVar24[-1][3];
                  pfVar2 = pafVar13[-1] + lVar26;
                  fVar35 = *pfVar2;
                  fVar37 = pfVar2[1];
                  fVar39 = pfVar2[2];
                  fVar41 = pfVar2[3];
                  pfVar2 = pafVar12[-1] + lVar26;
                  *pfVar2 = fVar74 + fVar51 + fVar35;
                  pfVar2[1] = fVar75 + fVar53 + fVar37;
                  pfVar2[2] = fVar76 + fVar55 + fVar39;
                  pfVar2[3] = fVar77 + fVar57 + fVar41;
                  pfVar2 = *pafVar13 + lVar26;
                  fVar34 = *pfVar2;
                  fVar36 = pfVar2[1];
                  fVar38 = pfVar2[2];
                  fVar40 = pfVar2[3];
                  pfVar2 = *pafVar12 + lVar26;
                  *pfVar2 = fVar66 + fVar42 + fVar34;
                  pfVar2[1] = fVar67 + fVar43 + fVar36;
                  pfVar2[2] = fVar68 + fVar44 + fVar38;
                  pfVar2[3] = fVar69 + fVar45 + fVar40;
                  fVar46 = (fVar74 * 0.309017 - fVar51 * 0.809017) + fVar35;
                  fVar47 = (fVar75 * 0.309017 - fVar53 * 0.809017) + fVar37;
                  fVar48 = (fVar76 * 0.309017 - fVar55 * 0.809017) + fVar39;
                  fVar49 = (fVar77 * 0.309017 - fVar57 * 0.809017) + fVar41;
                  fVar70 = (fVar66 * 0.309017 - fVar42 * 0.809017) + fVar34;
                  fVar71 = (fVar67 * 0.309017 - fVar43 * 0.809017) + fVar36;
                  fVar72 = (fVar68 * 0.309017 - fVar44 * 0.809017) + fVar38;
                  fVar73 = (fVar69 * 0.309017 - fVar45 * 0.809017) + fVar40;
                  fVar35 = (fVar51 * 0.309017 - fVar74 * 0.809017) + fVar35;
                  fVar37 = (fVar53 * 0.309017 - fVar75 * 0.809017) + fVar37;
                  fVar39 = (fVar55 * 0.309017 - fVar76 * 0.809017) + fVar39;
                  fVar41 = (fVar57 * 0.309017 - fVar77 * 0.809017) + fVar41;
                  fVar34 = (fVar42 * 0.309017 - fVar66 * 0.809017) + fVar34;
                  fVar36 = (fVar43 * 0.309017 - fVar67 * 0.809017) + fVar36;
                  fVar38 = (fVar44 * 0.309017 - fVar68 * 0.809017) + fVar38;
                  fVar40 = (fVar45 * 0.309017 - fVar69 * 0.809017) + fVar40;
                  fVar66 = fVar62 * 0.58778524 + fVar58 * 0.95105654;
                  fVar67 = fVar63 * 0.58778524 + fVar59 * 0.95105654;
                  fVar68 = fVar64 * 0.58778524 + fVar60 * 0.95105654;
                  fVar69 = fVar65 * 0.58778524 + fVar61 * 0.95105654;
                  fVar74 = fVar50 * 0.58778524 + fVar30 * 0.95105654;
                  fVar75 = fVar52 * 0.58778524 + fVar31 * 0.95105654;
                  fVar76 = fVar54 * 0.58778524 + fVar32 * 0.95105654;
                  fVar77 = fVar56 * 0.58778524 + fVar33 * 0.95105654;
                  fVar51 = fVar58 * 0.58778524 - fVar62 * 0.95105654;
                  fVar53 = fVar59 * 0.58778524 - fVar63 * 0.95105654;
                  fVar55 = fVar60 * 0.58778524 - fVar64 * 0.95105654;
                  fVar57 = fVar61 * 0.58778524 - fVar65 * 0.95105654;
                  fVar42 = fVar30 * 0.58778524 - fVar50 * 0.95105654;
                  fVar43 = fVar31 * 0.58778524 - fVar52 * 0.95105654;
                  fVar44 = fVar32 * 0.58778524 - fVar54 * 0.95105654;
                  fVar45 = fVar33 * 0.58778524 - fVar56 * 0.95105654;
                  fVar50 = fVar35 - fVar42;
                  fVar52 = fVar37 - fVar43;
                  fVar54 = fVar39 - fVar44;
                  fVar56 = fVar41 - fVar45;
                  fVar42 = fVar42 + fVar35;
                  fVar43 = fVar43 + fVar37;
                  fVar44 = fVar44 + fVar39;
                  fVar45 = fVar45 + fVar41;
                  fVar62 = fVar51 + fVar34;
                  fVar63 = fVar53 + fVar36;
                  fVar64 = fVar55 + fVar38;
                  fVar65 = fVar57 + fVar40;
                  fVar34 = fVar34 - fVar51;
                  fVar36 = fVar36 - fVar53;
                  fVar38 = fVar38 - fVar55;
                  fVar40 = fVar40 - fVar57;
                  fVar51 = fVar74 + fVar46;
                  fVar53 = fVar75 + fVar47;
                  fVar55 = fVar76 + fVar48;
                  fVar57 = fVar77 + fVar49;
                  fVar46 = fVar46 - fVar74;
                  fVar47 = fVar47 - fVar75;
                  fVar48 = fVar48 - fVar76;
                  fVar49 = fVar49 - fVar77;
                  fVar58 = fVar70 - fVar66;
                  fVar59 = fVar71 - fVar67;
                  fVar60 = fVar72 - fVar68;
                  fVar61 = fVar73 - fVar69;
                  fVar66 = fVar66 + fVar70;
                  fVar67 = fVar67 + fVar71;
                  fVar68 = fVar68 + fVar72;
                  fVar69 = fVar69 + fVar73;
                  fVar35 = *(float *)((long)wa + lVar26 + (long)iVar14 * 4);
                  fVar37 = *(float *)((long)wa + lVar26 + (long)iVar14 * 4 + 4);
                  fVar39 = *(float *)((long)wa + lVar26 + lVar25);
                  fVar41 = *(float *)((long)wa + lVar26 + lVar25 + 4);
                  fVar30 = *(float *)((long)wa + lVar26 + lVar23);
                  fVar31 = *(float *)((long)wa + lVar26 + lVar23 + 4);
                  fVar32 = *(float *)((long)wa + lVar26 + lVar21);
                  fVar33 = *(float *)((long)wa + lVar26 + lVar21 + 4);
                  pfVar2 = pafVar16[-1] + lVar26;
                  *pfVar2 = fVar46 * fVar35 - fVar37 * fVar66;
                  pfVar2[1] = fVar47 * fVar35 - fVar37 * fVar67;
                  pfVar2[2] = fVar48 * fVar35 - fVar37 * fVar68;
                  pfVar2[3] = fVar49 * fVar35 - fVar37 * fVar69;
                  pfVar2 = *pafVar16 + lVar26;
                  *pfVar2 = fVar35 * fVar66 + fVar46 * fVar37;
                  pfVar2[1] = fVar35 * fVar67 + fVar47 * fVar37;
                  pfVar2[2] = fVar35 * fVar68 + fVar48 * fVar37;
                  pfVar2[3] = fVar35 * fVar69 + fVar49 * fVar37;
                  pfVar2 = pafVar22[-1] + lVar26;
                  *pfVar2 = fVar50 * fVar39 - fVar41 * fVar62;
                  pfVar2[1] = fVar52 * fVar39 - fVar41 * fVar63;
                  pfVar2[2] = fVar54 * fVar39 - fVar41 * fVar64;
                  pfVar2[3] = fVar56 * fVar39 - fVar41 * fVar65;
                  pfVar2 = *pafVar22 + lVar26;
                  *pfVar2 = fVar39 * fVar62 + fVar50 * fVar41;
                  pfVar2[1] = fVar39 * fVar63 + fVar52 * fVar41;
                  pfVar2[2] = fVar39 * fVar64 + fVar54 * fVar41;
                  pfVar2[3] = fVar39 * fVar65 + fVar56 * fVar41;
                  pfVar2 = pafVar27[-1] + lVar26;
                  *pfVar2 = fVar42 * fVar30 - fVar31 * fVar34;
                  pfVar2[1] = fVar43 * fVar30 - fVar31 * fVar36;
                  pfVar2[2] = fVar44 * fVar30 - fVar31 * fVar38;
                  pfVar2[3] = fVar45 * fVar30 - fVar31 * fVar40;
                  pfVar2 = *pafVar27 + lVar26;
                  *pfVar2 = fVar30 * fVar34 + fVar42 * fVar31;
                  pfVar2[1] = fVar30 * fVar36 + fVar43 * fVar31;
                  pfVar2[2] = fVar30 * fVar38 + fVar44 * fVar31;
                  pfVar2[3] = fVar30 * fVar40 + fVar45 * fVar31;
                  pfVar2 = pafVar9[-1] + lVar26;
                  *pfVar2 = fVar51 * fVar32 - fVar33 * fVar58;
                  pfVar2[1] = fVar53 * fVar32 - fVar33 * fVar59;
                  pfVar2[2] = fVar55 * fVar32 - fVar33 * fVar60;
                  pfVar2[3] = fVar57 * fVar32 - fVar33 * fVar61;
                  pfVar2 = *pafVar9 + lVar26;
                  *pfVar2 = fVar32 * fVar58 + fVar51 * fVar33;
                  pfVar2[1] = fVar32 * fVar59 + fVar53 * fVar33;
                  pfVar2[2] = fVar32 * fVar60 + fVar55 * fVar33;
                  pfVar2[3] = fVar32 * fVar61 + fVar57 * fVar33;
                  lVar15 = lVar15 + 2;
                  lVar26 = lVar26 + 8;
                  pafVar24 = pafVar24 + -2;
                  pafVar10 = pafVar10 + -2;
                } while (lVar15 <= lVar8);
              }
              uVar7 = uVar7 + 1;
              pafVar9 = pafVar9 + lVar8;
              pafVar27 = pafVar27 + lVar8;
              pafVar22 = pafVar22 + lVar8;
              pafVar16 = pafVar16 + lVar8;
              pafVar12 = pafVar12 + lVar8;
              pafVar13 = pafVar13 + lVar8 * 5;
              pafVar19 = pafVar19 + lVar8 * 5;
              pafVar20 = pafVar20 + lVar8 * 5;
              local_90 = local_90 + lVar8 * 5;
              local_98 = local_98 + lVar8 * 5;
            } while (uVar7 != l1 + 1);
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                        ,0x40f,
                        "v4sf *rfftb1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)"
                       );
        }
        lVar17 = lVar17 + 1;
        iVar14 = iVar14 + (iVar6 + -1) * local_100;
        bVar29 = local_f0 == work2;
        input_readonly = work1;
        local_f0 = work2;
        if (bVar29) {
          input_readonly = work2;
          local_f0 = work1;
        }
        uVar7 = (ulong)(iVar6 * l1);
      } while (lVar17 != (ulong)uVar5 + 1);
    }
    return input_readonly;
  }
  __assert_fail("in != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                ,0x3f6,
                "v4sf *rfftb1_ps(int, const v4sf *, v4sf *, v4sf *, const float *, const int *)");
}

Assistant:

static NEVER_INLINE(v4sf *) rfftb1_ps(int n, const v4sf *input_readonly, v4sf *work1, v4sf *work2, 
                                      const float *wa, const int *ifac) {  
  v4sf *in  = (v4sf*)input_readonly;
  v4sf *out = (in == work2 ? work1 : work2);
  int nf = ifac[1], k1;
  int l1 = 1;
  int iw = 0;
  assert(in != out);
  for (k1=1; k1<=nf; k1++) {
    int ip = ifac[k1 + 1];
    int l2 = ip*l1;
    int ido = n / l2;
    switch (ip) {
      case 5: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        int ix4 = ix3 + ido;
        radb5_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3], &wa[ix4]);
      } break;
      case 4: {
        int ix2 = iw + ido;
        int ix3 = ix2 + ido;
        radb4_ps(ido, l1, in, out, &wa[iw], &wa[ix2], &wa[ix3]);
      } break;
      case 3: {
        int ix2 = iw + ido;
        radb3_ps(ido, l1, in, out, &wa[iw], &wa[ix2]);
      } break;
      case 2:
        radb2_ps(ido, l1, in, out, &wa[iw]);
        break;
      default:
        assert(0);
        break;
    }
    l1 = l2;
    iw += (ip - 1)*ido;

    if (out == work2) {
      out = work1; in = work2;
    } else {
      out = work2; in = work1;
    }
  }
  return in; /* this is in fact the output .. */
}